

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::ParseDynamic
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,EncodedChar *body,
          EncodedChar *bodyLim,EncodedChar *opts,EncodedChar *optsLim,RegexFlags *flags)

{
  ParseError *pPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ScriptConfiguration *pSVar5;
  undefined8 *puVar6;
  Node *pNVar7;
  Node *root;
  RegexFlags *flags_local;
  EncodedChar *optsLim_local;
  EncodedChar *opts_local;
  EncodedChar *bodyLim_local;
  EncodedChar *body_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this_local;
  
  if (body == (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb01,"(body != 0)","body != 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((bodyLim < body) || (*bodyLim != L'\0')) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb02,"(bodyLim >= body && *bodyLim == 0)",
                       "bodyLim >= body && *bodyLim == 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((opts != (EncodedChar *)0x0) && ((optsLim < opts || (*optsLim != L'\0')))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb03,"(opts == 0 || (optsLim >= opts && *optsLim == 0))",
                       "opts == 0 || (optsLim >= opts && *optsLim == 0)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  SetPosition(this,body,bodyLim,true);
  PatternPass0(this);
  bVar3 = IsEOF(this);
  if (!bVar3) {
    Fail(this,-0x7ff5ec67);
  }
  if (opts == (EncodedChar *)0x0) {
    this->unicodeFlagPresent = false;
    this->caseInsensitiveFlagPresent = false;
    this->dotAllFlagPresent = false;
  }
  else {
    SetPosition(this,opts,optsLim,false);
    Options(this,flags);
    bVar3 = IsEOF(this);
    if (!bVar3) {
      Fail(this,-0x7ff5ec67);
    }
    this->unicodeFlagPresent = (*flags & UnicodeRegexFlag) == UnicodeRegexFlag;
    this->caseInsensitiveFlagPresent = (*flags & IgnoreCaseRegexFlag) == IgnoreCaseRegexFlag;
    this->dotAllFlagPresent = (*flags & DotAllRegexFlag) == DotAllRegexFlag;
    if ((this->unicodeFlagPresent & 1U) != 0) {
      pSVar5 = Js::ScriptContext::GetConfig(this->scriptContext);
      bVar3 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(pSVar5);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xb16,
                           "(!this->unicodeFlagPresent || scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())"
                           ,
                           "!this->unicodeFlagPresent || scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
    if ((this->dotAllFlagPresent & 1U) != 0) {
      pSVar5 = Js::ScriptContext::GetConfig(this->scriptContext);
      bVar3 = Js::ScriptConfiguration::IsES2018RegExDotAllEnabled(pSVar5);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xb17,
                           "(!this->dotAllFlagPresent || scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())"
                           ,
                           "!this->dotAllFlagPresent || scriptContext->GetConfig()->IsES2018RegExDotAllEnabled()"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
  }
  if ((this->deferredIfNotUnicodeError != (ParseError *)0x0) &&
     ((this->unicodeFlagPresent & 1U) == 0)) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
    pPVar1 = this->deferredIfNotUnicodeError;
    *puVar6 = *(undefined8 *)pPVar1;
    puVar6[1] = *(undefined8 *)&pPVar1->encodedPos;
    __cxa_throw(puVar6,&ParseError::typeinfo,0);
  }
  if ((this->deferredIfUnicodeError != (ParseError *)0x0) && ((this->unicodeFlagPresent & 1U) != 0))
  {
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
    pPVar1 = this->deferredIfUnicodeError;
    *puVar6 = *(undefined8 *)pPVar1;
    puVar6[1] = *(undefined8 *)&pPVar1->encodedPos;
    __cxa_throw(puVar6,&ParseError::typeinfo,0);
  }
  this->currentSurrogatePairNode = this->surrogatePairList;
  SetPosition(this,body,bodyLim,true);
  pNVar7 = PatternPass1(this);
  bVar3 = IsEOF(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb2f,"(IsEOF())","IsEOF()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return pNVar7;
}

Assistant:

Node* Parser<P, IsLiteral>::ParseDynamic
        ( const EncodedChar* body
        , const EncodedChar* bodyLim
        , const EncodedChar* opts
        , const EncodedChar* optsLim
        , RegexFlags& flags )
    {
        Assert(!IsLiteral);
        Assert(body != 0);
        Assert(bodyLim >= body && *bodyLim == 0);
        Assert(opts == 0 || (optsLim >= opts && *optsLim == 0));

        // Body, pass 0
        SetPosition(body, bodyLim, true);

        PatternPass0();
        if (!IsEOF())
            Fail(JSERR_RegExpSyntax);

        // Options
        if (opts != 0)
        {
            SetPosition(opts, optsLim, false);
            Options(flags);
            if (!IsEOF())
                Fail(JSERR_RegExpSyntax);
            this->unicodeFlagPresent = (flags & UnifiedRegex::UnicodeRegexFlag) == UnifiedRegex::UnicodeRegexFlag;
            this->caseInsensitiveFlagPresent = (flags & UnifiedRegex::IgnoreCaseRegexFlag) == UnifiedRegex::IgnoreCaseRegexFlag;
            this->dotAllFlagPresent = (flags & UnifiedRegex::DotAllRegexFlag) == UnifiedRegex::DotAllRegexFlag;
            Assert(!this->unicodeFlagPresent || scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());
            Assert(!this->dotAllFlagPresent || scriptContext->GetConfig()->IsES2018RegExDotAllEnabled());
        }
        else
        {
            this->unicodeFlagPresent = false;
            this->caseInsensitiveFlagPresent = false;
            this->dotAllFlagPresent = false;
        }

        // If this HR has been set, that means we have an earlier failure than the one caught above.
        if (this->deferredIfNotUnicodeError != nullptr && !this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfNotUnicodeError);
        }
        else if(this->deferredIfUnicodeError != nullptr && this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfUnicodeError);
        }

        this->currentSurrogatePairNode = this->surrogatePairList;

        // Body, pass 1
        SetPosition(body, bodyLim, true);
        Node* root = PatternPass1();
        Assert(IsEOF());


        return root;
    }